

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O1

cf_void_t cf_hashtbl_delete(cf_hashtbl_t *self)

{
  hashtbl_node *phVar1;
  hashtbl_node_t *__ptr;
  ulong uVar2;
  
  if (self == (cf_hashtbl_t *)0x0) {
    return;
  }
  if (self->hashmsk != 0xffffffff) {
    uVar2 = 0;
    do {
      __ptr = self->table[uVar2];
      while (__ptr != (hashtbl_node_t *)0x0) {
        phVar1 = __ptr->next;
        if (__ptr->key != (void *)0x0) {
          free(__ptr->key);
        }
        if (self->callback != (cf_hashtbl_cb_f)0x0) {
          (*self->callback)(__ptr->value);
        }
        free(__ptr);
        __ptr = phVar1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < self->hashmsk + 1);
  }
  if (self->table != (hashtbl_node_t **)0x0) {
    free(self->table);
  }
  free(self);
  return;
}

Assistant:

cf_void_t cf_hashtbl_delete(cf_hashtbl_t* self) {
    hashtbl_node_t* p, *n;
    cf_uint32_t i;
    if (CF_NULL_PTR == self) return ;

    /* destroy table items and apply callback */
    for (i = 0; i < self->hashmsk + 1; i++) {
        n = self->table[i]; 
        if (!n) continue;

        p = n;
        while (p) {
            n = p->next;
            if(p->key) {
                cf_free_native(p->key);
            }
            if (self->callback) {
                self->callback(p->value);
            }
            cf_free_native(p);
            p = n;
        }
    } 

    if (self->table) {
        cf_free_native(self->table);
    }
    cf_free_native(self);
}